

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

StringPtr __thiscall kj::HttpHeaderId::toString(HttpHeaderId *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  HttpHeaderId id;
  Fault local_60;
  Fault f;
  uint *local_50;
  undefined1 local_48 [8];
  DebugComparison<const_unsigned_int_&,_unsigned_long> _kjCondition;
  HttpHeaderId *this_local;
  
  _kjCondition._32_8_ = this;
  if (this->table == (HttpHeaderTable *)0x0) {
    local_50 = (uint *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->id);
    f.exception = (Exception *)
                  size<char_const*,17ul>
                            ((char *(*) [17])kj::(anonymous_namespace)::BUILTIN_HEADER_NAMES);
    kj::_::DebugExpression<unsigned_int_const&>::operator<
              ((DebugComparison<const_unsigned_int_&,_unsigned_long> *)local_48,
               (DebugExpression<unsigned_int_const&> *)&local_50,(unsigned_long *)&f);
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int_const&,unsigned_long>&>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x20d,FAILED,"id < kj::size(BUILTIN_HEADER_NAMES)","_kjCondition,",
                 (DebugComparison<const_unsigned_int_&,_unsigned_long> *)local_48);
      kj::_::Debug::Fault::fatal(&local_60);
    }
    StringPtr::StringPtr
              ((StringPtr *)&this_local,
               *(char **)(kj::(anonymous_namespace)::BUILTIN_HEADER_NAMES + (ulong)this->id * 8));
  }
  else {
    uVar1 = this->table;
    uVar2 = this->id;
    id.id = uVar2;
    id.table = (HttpHeaderTable *)uVar1;
    id._12_4_ = 0;
    _this_local = (ArrayPtr<const_char>)HttpHeaderTable::idToString(this->table,id);
  }
  return (StringPtr)_this_local;
}

Assistant:

kj::StringPtr HttpHeaderId::toString() const {
  if (table == nullptr) {
    KJ_ASSERT(id < kj::size(BUILTIN_HEADER_NAMES));
    return BUILTIN_HEADER_NAMES[id];
  } else {
    return table->idToString(*this);
  }
}